

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O1

void doFormatString<std::__cxx11::wstring_const,std::__cxx11::wstring,unsigned_long>
               (wstringstream *stream,wchar_t *format,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *first,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *rest,
               unsigned_long *rest_1)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t *local_40;
  wchar_t local_34;
  
  local_40 = format;
  while( true ) {
    wVar1 = *local_40;
    if (wVar1 == L'\0') {
      return;
    }
    local_40 = local_40 + 1;
    if (wVar1 == L'%') break;
    local_34 = wVar1;
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              ((wostream *)(stream + 0x10),&local_34,1);
  }
  bVar2 = doFormatSetup(stream,&local_40);
  if (bVar2) {
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              ((wostream *)(stream + 0x10),(first->_M_dataplus)._M_p,first->_M_string_length);
  }
  doFormatString<std::__cxx11::wstring_const,unsigned_long>(stream,local_40,rest,rest_1);
  return;
}

Assistant:

void doFormatString(std::wstringstream& stream, const wchar_t* format, First& first, const Rest&... rest)
{
	while (*format != 0)
	{
		if (*format == '%')
		{
			format++;
			if (doFormatSetup(stream,format))
				stream << first;
			doFormatString(stream,format,rest...);
			return;
		}

		stream << *format++;
	}
}